

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::printPartialUsage(Synth *this,Bit32u sampleOffset)

{
  Bit32u BVar1;
  uint uVar2;
  uint uVar3;
  uint local_58;
  uint local_54;
  uint partialUsage [9];
  Bit32u sampleOffset_local;
  Synth *this_local;
  
  partialUsage[7] = sampleOffset;
  unique0x100000f3 = this;
  PartialManager::getPerPartPartialUsage(this->partialManager,&local_58);
  uVar3 = partialUsage[7];
  if (partialUsage[7] == 0) {
    BVar1 = getPartialCount(this);
    uVar3 = PartialManager::getFreePartialCount(this->partialManager);
    printDebug(this,
               "Partial Usage: 1:%02d 2:%02d 3:%02d 4:%02d 5:%02d 6:%02d 7:%02d 8:%02d R: %02d  TOTAL: %02d"
               ,(ulong)local_58,(ulong)local_54,(ulong)partialUsage[0],(ulong)partialUsage[1],
               partialUsage[2],partialUsage[3],partialUsage[4],partialUsage[5],partialUsage[6],
               BVar1 - uVar3);
  }
  else {
    BVar1 = getPartialCount(this);
    uVar2 = PartialManager::getFreePartialCount(this->partialManager);
    printDebug(this,
               "[+%u] Partial Usage: 1:%02d 2:%02d 3:%02d 4:%02d 5:%02d 6:%02d 7:%02d 8:%02d R: %02d  TOTAL: %02d"
               ,(ulong)uVar3,(ulong)local_58,(ulong)local_54,(ulong)partialUsage[0],partialUsage[1],
               partialUsage[2],partialUsage[3],partialUsage[4],partialUsage[5],partialUsage[6],
               BVar1 - uVar2);
  }
  return;
}

Assistant:

void Synth::printPartialUsage(Bit32u sampleOffset) {
	unsigned int partialUsage[9];
	partialManager->getPerPartPartialUsage(partialUsage);
	if (sampleOffset > 0) {
		printDebug("[+%u] Partial Usage: 1:%02d 2:%02d 3:%02d 4:%02d 5:%02d 6:%02d 7:%02d 8:%02d R: %02d  TOTAL: %02d", sampleOffset, partialUsage[0], partialUsage[1], partialUsage[2], partialUsage[3], partialUsage[4], partialUsage[5], partialUsage[6], partialUsage[7], partialUsage[8], getPartialCount() - partialManager->getFreePartialCount());
	} else {
		printDebug("Partial Usage: 1:%02d 2:%02d 3:%02d 4:%02d 5:%02d 6:%02d 7:%02d 8:%02d R: %02d  TOTAL: %02d", partialUsage[0], partialUsage[1], partialUsage[2], partialUsage[3], partialUsage[4], partialUsage[5], partialUsage[6], partialUsage[7], partialUsage[8], getPartialCount() - partialManager->getFreePartialCount());
	}
}